

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::BinaryOp_x86_functor::binary_op_add>
              (Mat *a,float b,Mat *c,Option *opt)

{
  long *in_RSI;
  long *in_RDI;
  float fVar1;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  __m128 afVar2;
  __m128 _p;
  __m128 _b;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_add op;
  Mat *m;
  Mat *m_1;
  __m128 local_2d8;
  float local_2c8 [7];
  int local_2ac;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  long local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined8 local_268;
  float *local_260;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined4 local_230;
  long local_228;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined8 local_208;
  float *local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  binary_op_add local_1e9 [9];
  long *local_1e0;
  float local_1d4;
  long *local_1d0;
  undefined1 local_1c5;
  int local_1c4;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a0;
  undefined8 *local_190;
  undefined1 local_17d;
  int local_17c;
  undefined8 *local_170;
  undefined8 *local_160;
  __m128 *pafStack_140;
  undefined8 local_138;
  float afStack_130 [2];
  float *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  float *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  float *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_68;
  undefined8 *local_48;
  
  local_1f0 = (int)in_RDI[7];
  local_1f4 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_1e0 = in_RSI;
  local_1d0 = in_RDI;
  for (local_1f8 = 0; local_1f8 < local_1f0; local_1f8 = local_1f8 + 1) {
    local_1b8 = &local_248;
    local_bc = *(int *)((long)local_1d0 + 0x2c);
    local_c0 = (int)local_1d0[6];
    local_c4 = *(undefined4 *)((long)local_1d0 + 0x34);
    local_200 = (float *)(*local_1d0 + local_1d0[8] * (long)local_1f8 * local_1d0[2]);
    local_d8 = local_1d0[2];
    local_dc = (undefined4)local_1d0[3];
    local_e8 = local_1d0[4];
    local_b8 = &local_248;
    local_a8 = (long)local_bc * (long)local_c0 * local_d8;
    local_1b0 = &local_248;
    local_1a0 = &local_248;
    local_170 = &local_2a8;
    local_f4 = *(int *)((long)local_1e0 + 0x2c);
    local_f8 = (int)local_1e0[6];
    local_fc = *(undefined4 *)((long)local_1e0 + 0x34);
    local_260 = (float *)(*local_1e0 + local_1e0[8] * (long)local_1f8 * local_1e0[2]);
    local_110 = local_1e0[2];
    local_114 = (undefined4)local_1e0[3];
    local_120 = local_1e0[4];
    local_f0 = &local_2a8;
    local_98 = (long)local_f4 * (long)local_f8 * local_110;
    local_160 = &local_2a8;
    local_190 = &local_2a8;
    local_210 = 0;
    local_214 = 0;
    local_218 = 0;
    local_21c = 0;
    local_230 = 0;
    local_238 = 0;
    local_240 = 0;
    local_248 = 0;
    local_9c = 0x10;
    local_ac = 0x10;
    local_17c = local_1f8;
    local_17d = 1;
    local_1c4 = local_1f8;
    local_1c5 = 1;
    local_208 = 0;
    local_220 = 0;
    local_2a8 = 0;
    local_298 = 0;
    local_290 = 0;
    local_280 = 0;
    local_27c = 0;
    local_278 = 0;
    local_274 = 0;
    local_270 = 0;
    local_268 = 0;
    local_2a0 = 0;
    local_108 = local_260;
    local_d0 = local_200;
    local_68 = local_190;
    local_48 = local_1a0;
    local_288 = local_120;
    local_228 = local_e8;
    for (local_2ac = 0; local_2ac + 3 < local_1f4; local_2ac = local_2ac + 4) {
      pafStack_140 = (__m128 *)local_200;
      local_2d8 = *(__m128 *)local_200;
      afVar2 = BinaryOp_x86_functor::binary_op_add::func_pack4
                         (local_1e9,&local_2d8,(__m128 *)local_2c8);
      local_138 = afVar2._0_8_;
      afVar2[2] = (float)extraout_XMM0_Dc;
      afVar2[0] = (float)(int)local_138;
      afVar2[1] = (float)(int)((ulong)local_138 >> 0x20);
      afVar2[3] = extraout_XMM0_Dd;
      local_128 = local_260;
      local_2d8._8_8_ = afVar2._8_8_;
      afStack_130[0] = local_2d8[2];
      afStack_130[1] = local_2d8[3];
      *(undefined8 *)local_260 = local_138;
      *(undefined8 *)(local_260 + 2) = local_2d8._8_8_;
      local_200 = (float *)((long)local_200 + 0x10);
      local_260 = local_260 + 4;
      local_2d8 = afVar2;
    }
    for (; local_2ac < local_1f4; local_2ac = local_2ac + 1) {
      fVar1 = BinaryOp_x86_functor::binary_op_add::func(local_1e9,local_200,&local_1d4);
      *local_260 = fVar1;
      local_200 = local_200 + 1;
      local_260 = local_260 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps(b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b);
            ptr++;
            outptr++;
        }
    }

    return 0;
}